

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::Set
          (RepeatedField<unsigned_long> *this,int index,unsigned_long *value)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  unsigned_long *in_RDX;
  int in_ESI;
  RepeatedField<unsigned_long> *in_stack_ffffffffffffff90;
  
  uVar1 = *in_RDX;
  puVar2 = elements(in_stack_ffffffffffffff90);
  puVar2[in_ESI] = uVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Set(int index, const Element& value) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  elements()[index] = value;
}